

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void state_texbem(Context *ctx,char *opcode)

{
  uint uVar1;
  byte bVar2;
  
  uVar1 = (uint)ctx->minor_ver;
  if (ctx->minor_ver == 0xff) {
    uVar1 = 0;
  }
  if (0x10003 < (uVar1 | (uint)ctx->major_ver << 0x10)) {
    failf(ctx,"%s opcode not available after Shader Model 1.3",opcode);
  }
  bVar2 = 0;
  if (ctx->minor_ver != 0xff) {
    bVar2 = ctx->minor_ver;
  }
  if ((((uint)bVar2 | (uint)ctx->major_ver << 0x10) < 0x10002) &&
     (ctx->source_args[0].src_mod == SRCMOD_SIGN)) {
    failf(ctx,"%s forbids _bx2 on source reg before ps_1_2",opcode);
  }
  state_texops(ctx,opcode,2,1);
  return;
}

Assistant:

static void state_texbem(Context *ctx, const char *opcode)
{
    // The TEXBEM equasion, according to MSDN:
    //u' = TextureCoordinates(stage m)u + D3DTSS_BUMPENVMAT00(stage m)*t(n)R
    //         + D3DTSS_BUMPENVMAT10(stage m)*t(n)G
    //v' = TextureCoordinates(stage m)v + D3DTSS_BUMPENVMAT01(stage m)*t(n)R
    //         + D3DTSS_BUMPENVMAT11(stage m)*t(n)G
    //t(m)RGBA = TextureSample(stage m)
    //
    // ...TEXBEML adds this at the end:
    //t(m)RGBA = t(m)RGBA * [(t(n)B * D3DTSS_BUMPENVLSCALE(stage m)) +
    //           D3DTSS_BUMPENVLOFFSET(stage m)]

    if (shader_version_atleast(ctx, 1, 4))
        failf(ctx, "%s opcode not available after Shader Model 1.3", opcode);

    if (!shader_version_atleast(ctx, 1, 2))
    {
        if (ctx->source_args[0].src_mod == SRCMOD_SIGN)
            failf(ctx, "%s forbids _bx2 on source reg before ps_1_2", opcode);
    } // if

    // !!! FIXME: MSDN:
    // !!! FIXME: Register data that has been read by a texbem
    // !!! FIXME:  or texbeml instruction cannot be read later,
    // !!! FIXME:  except by another texbem or texbeml.

    state_texops(ctx, opcode, 2, 1);
}